

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *values)

{
  Module *pMVar1;
  ArrayNewFixed *pAVar2;
  Type local_30;
  
  pMVar1 = this->wasm;
  pAVar2 = (ArrayNewFixed *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x158),0x30,8);
  (pAVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id =
       ArrayNewFixedId;
  (pAVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = 0;
  (pAVar2->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pAVar2->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pAVar2->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pAVar2->values).allocator = (MixedArena *)(pMVar1 + 0x158);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pAVar2->values,
             values);
  wasm::Type::Type(&local_30,type,NonNullable);
  (pAVar2->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_30.id;
  wasm::ArrayNewFixed::finalize();
  return pAVar2;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type,
                                   const std::vector<Expression*>& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }